

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteDenseArrayIndexProperties
          (SerializationCloner<Js::StreamWriter> *this,JavascriptArray *arr)

{
  bool bVar1;
  int iVar2;
  JavascriptArray *arr_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  bVar1 = Js::JavascriptArray::IsNonES5Array(arr);
  if (bVar1) {
    iVar2 = (*(arr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x66])();
    if (iVar2 == 0) {
      WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayDirectItemAccessor>
                (this,arr);
    }
    else {
      WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayItemAccessor>
                (this,arr);
    }
  }
  else {
    WriteArrayIndexProperties<Js::SerializationCloner<Js::StreamWriter>::JavascriptArrayEnumerableItemAccessor>
              (this,arr);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::WriteDenseArrayIndexProperties(JavascriptArray* arr)
    {
        if (JavascriptArray::IsNonES5Array(arr))
        {
            if (!arr->IsCrossSiteObject())
            {
                WriteArrayIndexProperties<JavascriptArrayDirectItemAccessor>(arr);
            }
            else
            {
                WriteArrayIndexProperties<JavascriptArrayItemAccessor>(arr);
            }
        }
        else
        {
            WriteArrayIndexProperties<JavascriptArrayEnumerableItemAccessor>(arr);
        }
    }